

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestCoverageCommand::InitializeHandler(cmCTestCoverageCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestCoverageHandler *this_00;
  allocator<char> local_39;
  string local_38;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_COVERAGE_COMMAND",&local_39);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageCommand",&local_38,(this->super_cmCTestHandlerCommand).Quiet);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_COVERAGE_EXTRA_FLAGS",&local_39);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageExtraFlags",&local_38,(this->super_cmCTestHandlerCommand).Quiet)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = (cmCTestCoverageHandler *)
            cmCTest::GetInitializedHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"coverage");
  if (this_00 == (cmCTestCoverageHandler *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"internal CTest error. Cannot instantiate test handler",&local_39
              );
    cmCommand::SetError((cmCommand *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    if (this->LabelsMentioned == true) {
      cmCTestCoverageHandler::SetLabelFilter(this_00,&this->Labels);
    }
    (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestCoverageCommand::InitializeHandler()
{
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageCommand", "CTEST_COVERAGE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageExtraFlags", "CTEST_COVERAGE_EXTRA_FLAGS",
    this->Quiet);
  cmCTestCoverageHandler* handler = static_cast<cmCTestCoverageHandler*>(
    this->CTest->GetInitializedHandler("coverage"));
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate test handler");
    return nullptr;
  }

  // If a LABELS option was given, select only files with the labels.
  if (this->LabelsMentioned) {
    handler->SetLabelFilter(this->Labels);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}